

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

qreal __thiscall QEasingCurve::valueForProgress(QEasingCurve *this,qreal progress)

{
  EasingFunction UNRECOVERED_JUMPTABLE;
  QEasingCurveFunction *pQVar1;
  double dVar2;
  qreal qVar3;
  qreal extraout_XMM0_Qa;
  
  dVar2 = 1.0;
  if (progress <= 1.0) {
    dVar2 = progress;
  }
  if (dVar2 <= 0.0) {
    dVar2 = 0.0;
  }
  UNRECOVERED_JUMPTABLE = this->d_ptr->func;
  if (UNRECOVERED_JUMPTABLE != (EasingFunction)0x0) {
    qVar3 = (*UNRECOVERED_JUMPTABLE)(dVar2);
    return qVar3;
  }
  pQVar1 = this->d_ptr->config;
  if (pQVar1 != (QEasingCurveFunction *)0x0) {
    (*pQVar1->_vptr_QEasingCurveFunction[2])();
    return extraout_XMM0_Qa;
  }
  return dVar2;
}

Assistant:

qreal QEasingCurve::valueForProgress(qreal progress) const
{
    progress = qBound<qreal>(0, progress, 1);
    if (d_ptr->func)
        return d_ptr->func(progress);
    else if (d_ptr->config)
        return d_ptr->config->value(progress);
    else
        return progress;
}